

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O3

Result __thiscall wabt::ExprVisitor::VisitExpr(ExprVisitor *this,Expr *root_expr)

{
  pointer *ppSVar1;
  pointer *pppEVar2;
  pointer *ppiVar3;
  pointer ppEVar4;
  Expr *expr;
  Result RVar5;
  int iVar6;
  pointer pSVar7;
  char *__function;
  State state;
  pointer piVar8;
  iterator iVar9;
  
  pSVar7 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar7) {
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar7;
  }
  ppEVar4 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppEVar4) {
    (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar4;
  }
  piVar8 = (this->expr_iter_stack_).
           super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_finish != piVar8) {
    (this->expr_iter_stack_).
    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ._M_impl.super__Vector_impl_data._M_finish = piVar8;
  }
  PushDefault(this,root_expr);
  pSVar7 = (this->state_stack_).
           super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_start != pSVar7) {
    do {
      if (Catch < pSVar7[-1]) goto LAB_0017f101;
      ppEVar4 = (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      expr = ppEVar4[-1];
      switch(pSVar7[-1]) {
      case Default:
        (this->state_stack_).
        super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
        _M_impl.super__Vector_impl_data._M_finish = pSVar7 + -1;
        (this->expr_stack_).super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppEVar4 + -1;
        RVar5 = HandleDefaultState(this,expr);
        if (RVar5.enum_ == Error) {
          return (Result)Error;
        }
        break;
      case Block:
        if (expr->type_ != Block) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
          goto LAB_0017f1d5;
        }
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar8[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename.size_) {
LAB_0017f13d:
          __assert_fail("list_ == rhs.list_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                        ,0xc1,
                        "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                       );
        }
        if (piVar8[-1].node_ == (Expr *)0x0) {
          iVar6 = (*this->delegate_->_vptr_Delegate[4])();
          goto LAB_0017f0ed;
        }
LAB_0017f0bd:
        iVar9 = intrusive_list<wabt::Expr>::iterator::operator++(piVar8 + -1,0);
        if (iVar9.node_ == (Expr *)0x0) {
          __assert_fail("node_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                        ,0x9b,
                        "reference wabt::intrusive_list<wabt::Expr>::iterator::operator*() const [T = wabt::Expr]"
                       );
        }
        PushDefault(this,iVar9.node_);
        break;
      case IfTrue:
        if (expr->type_ != If) {
LAB_0017f192:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::IfExpr, Base = wabt::Expr]";
LAB_0017f1d5:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/cast.h"
                        ,0x4e,__function);
        }
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar8[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename.size_)
        goto LAB_0017f13d;
        if (piVar8[-1].node_ != (Expr *)0x0) goto LAB_0017f0bd;
        iVar6 = (*this->delegate_->_vptr_Delegate[0x12])(this->delegate_,expr);
        if (iVar6 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        state = IfFalse;
LAB_0017f08c:
        PushExprlist(this,state,expr,(ExprList *)&expr[4].loc);
        break;
      case IfFalse:
        if (expr->type_ != If) goto LAB_0017f192;
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((Location *)piVar8[-1].list_ != &expr[4].loc) goto LAB_0017f13d;
        if (piVar8[-1].node_ != (Expr *)0x0) goto LAB_0017f0bd;
        iVar6 = (*this->delegate_->_vptr_Delegate[0x13])();
        goto LAB_0017f0ed;
      case Loop:
        if (expr->type_ != Loop) {
          __function = 
          "Derived *wabt::cast(Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_0017f1d5;
        }
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar8[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename.size_)
        goto LAB_0017f13d;
        if (piVar8[-1].node_ != (Expr *)0x0) goto LAB_0017f0bd;
        iVar6 = (*this->delegate_->_vptr_Delegate[0x19])();
        goto LAB_0017f0ed;
      case Try:
        if (expr->type_ != Try) {
LAB_0017f17b:
          __function = "Derived *wabt::cast(Base *) [Derived = wabt::TryExpr, Base = wabt::Expr]";
          goto LAB_0017f1d5;
        }
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (piVar8[-1].list_ != (intrusive_list<wabt::Expr> *)&expr[3].loc.filename.size_)
        goto LAB_0017f13d;
        if (piVar8[-1].node_ != (Expr *)0x0) goto LAB_0017f0bd;
        iVar6 = (*this->delegate_->_vptr_Delegate[0x34])(this->delegate_,expr);
        if (iVar6 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
        if (expr[4].loc.field_1.field_1.offset != 0) {
          state = Catch;
          goto LAB_0017f08c;
        }
        iVar6 = (*this->delegate_->_vptr_Delegate[0x35])();
        if (iVar6 == 1) {
          return (Result)Error;
        }
        break;
      case Catch:
        if (expr->type_ != Try) goto LAB_0017f17b;
        piVar8 = (this->expr_iter_stack_).
                 super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((Location *)piVar8[-1].list_ != &expr[4].loc) goto LAB_0017f13d;
        if (piVar8[-1].node_ != (Expr *)0x0) goto LAB_0017f0bd;
        iVar6 = (*this->delegate_->_vptr_Delegate[0x35])();
LAB_0017f0ed:
        if (iVar6 == 1) {
          return (Result)Error;
        }
        ppSVar1 = &(this->state_stack_).
                   super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + -1;
        pppEVar2 = &(this->expr_stack_).
                    super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + -1;
        ppiVar3 = &(this->expr_iter_stack_).
                   super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppiVar3 = *ppiVar3 + -1;
      }
LAB_0017f101:
      pSVar7 = (this->state_stack_).
               super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->state_stack_).
             super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
             ._M_impl.super__Vector_impl_data._M_start != pSVar7);
  }
  return (Result)Ok;
}

Assistant:

Result ExprVisitor::VisitExpr(Expr* root_expr) {
  state_stack_.clear();
  expr_stack_.clear();
  expr_iter_stack_.clear();

  PushDefault(root_expr);

  while (!state_stack_.empty()) {
    State state = state_stack_.back();
    auto* expr = expr_stack_.back();

    switch (state) {
      case State::Default:
        PopDefault();
        CHECK_RESULT(HandleDefaultState(expr));
        break;

      case State::Block: {
        auto block_expr = cast<BlockExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != block_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndBlockExpr(block_expr));
          PopExprlist();
        }
        break;
      }

      case State::IfTrue: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->true_.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->AfterIfTrueExpr(if_expr));
          PopExprlist();
          PushExprlist(State::IfFalse, expr, if_expr->false_);
        }
        break;
      }

      case State::IfFalse: {
        auto if_expr = cast<IfExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != if_expr->false_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndIfExpr(if_expr));
          PopExprlist();
        }
        break;
      }

      case State::Loop: {
        auto loop_expr = cast<LoopExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != loop_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndLoopExpr(loop_expr));
          PopExprlist();
        }
        break;
      }

      case State::Try: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->block.exprs.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->OnCatchExpr(try_expr));
          PopExprlist();
          if (try_expr->catch_.empty()) {
            CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          } else {
            PushExprlist(State::Catch, expr, try_expr->catch_);
          }
        }
        break;
      }

      case State::Catch: {
        auto try_expr = cast<TryExpr>(expr);
        auto& iter = expr_iter_stack_.back();
        if (iter != try_expr->catch_.end()) {
          PushDefault(&*iter++);
        } else {
          CHECK_RESULT(delegate_->EndTryExpr(try_expr));
          PopExprlist();
        }
        break;
      }
    }
  }

  return Result::Ok;
}